

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t cmp_node_wcs(archive_rb_node *n1,archive_rb_node *n2)

{
  wchar_t *local_40;
  wchar_t *p2;
  wchar_t *p1;
  match_file *f2;
  match_file *f1;
  archive_rb_node *n2_local;
  archive_rb_node *n1_local;
  
  p1 = (wchar_t *)n2;
  f2 = (match_file *)n1;
  f1 = (match_file *)n2;
  n2_local = n1;
  archive_mstring_get_wcs((archive *)0x0,(archive_mstring *)(n1[1].rb_nodes + 1),&p2);
  archive_mstring_get_wcs((archive *)0x0,(archive_mstring *)(p1 + 8),&local_40);
  if (p2 == (wchar_t *)0x0) {
    n1_local._4_4_ = L'\x01';
  }
  else if (local_40 == (wchar_t *)0x0) {
    n1_local._4_4_ = L'\xffffffff';
  }
  else {
    n1_local._4_4_ = wcscmp(p2,local_40);
  }
  return n1_local._4_4_;
}

Assistant:

static int
cmp_node_wcs(const struct archive_rb_node *n1,
    const struct archive_rb_node *n2)
{
	struct match_file *f1 = (struct match_file *)(uintptr_t)n1;
	struct match_file *f2 = (struct match_file *)(uintptr_t)n2;
	const wchar_t *p1, *p2;

	archive_mstring_get_wcs(NULL, &(f1->pathname), &p1);
	archive_mstring_get_wcs(NULL, &(f2->pathname), &p2);
	if (p1 == NULL)
		return (1);
	if (p2 == NULL)
		return (-1);
	return (wcscmp(p1, p2));
}